

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O0

bool __thiscall Kumu::MemIOReader::ReadUi32BE(MemIOReader *this,ui32_t *i)

{
  bool bVar1;
  uint i_00;
  ui32_t uVar2;
  ui32_t *i_local;
  MemIOReader *this_local;
  
  if (i == (ui32_t *)0x0) {
    __assert_fail("i",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_memio.h"
                  ,0xc4,"bool Kumu::MemIOReader::ReadUi32BE(ui32_t *)");
  }
  bVar1 = (ulong)*(uint *)(this + 0xc) + 4 <= (ulong)*(uint *)(this + 8);
  if (bVar1) {
    i_00 = cp2i<unsigned_int>((byte_t *)(*(long *)this + (ulong)*(uint *)(this + 0xc)));
    uVar2 = Swap4(i_00);
    *i = uVar2;
    *(int *)(this + 0xc) = *(int *)(this + 0xc) + 4;
  }
  return bVar1;
}

Assistant:

inline bool ReadUi32BE(ui32_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui32_t) ) > m_capacity )
	  return false;

	*i = KM_i32_BE(cp2i<ui32_t>(m_p + m_size));
	m_size += sizeof(ui32_t);
	return true;
      }